

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall libtorrent::trackerid_alert::~trackerid_alert(trackerid_alert *this)

{
  trackerid_alert *this_local;
  
  ~trackerid_alert(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

struct TORRENT_EXPORT trackerid_alert final : tracker_alert
	{
		// internal
		trackerid_alert(aux::stack_allocator& alloc, torrent_handle const& h
			, tcp::endpoint const& ep , string_view u, const std::string& id);

		TORRENT_DEFINE_ALERT(trackerid_alert, 61)

		static constexpr alert_category_t static_category = alert_category::status;
		std::string message() const override;

		// The tracker ID returned by the tracker
		char const* tracker_id() const;

	private:
		aux::allocation_slot m_tracker_idx;
#if TORRENT_ABI_VERSION == 1
	public:
		// The tracker ID returned by the tracker
		std::string TORRENT_DEPRECATED_MEMBER trackerid;
#endif
	}